

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> * __thiscall
HighsSymmetryDetection::dumpCurrentGraph
          (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *__return_storage_ptr__,
          HighsSymmetryDetection *this)

{
  int iVar1;
  pointer ppVar2;
  undefined8 in_RAX;
  pointer piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  HighsInt colCell;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::HighsHashTable(__return_storage_ptr__);
  if (0 < this->numCol) {
    piVar3 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      uStack_38 = CONCAT44((this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar6],(undefined4)uStack_38);
      iVar4 = piVar3[lVar6];
      if (iVar4 != (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6]) {
        lVar5 = (long)iVar4 * 8 + 4;
        do {
          ppVar2 = (this->Gedge).
                   super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
                    ((HighsHashTable<std::tuple<int,int,unsigned_int>,void> *)__return_storage_ptr__
                     ,(this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + *(int *)((long)ppVar2 + lVar5 + -4),
                     (int *)((long)&uStack_38 + 4),(uint *)((long)&ppVar2->first + lVar5));
          iVar1 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          lVar5 = lVar5 + 8;
          iVar4 = iVar4 + 1;
        } while (iVar4 != iVar1);
        piVar3 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = iVar1;
      }
      lVar5 = lVar6 + 1;
      if (iVar4 != piVar3[lVar6 + 1]) {
        lVar6 = (long)iVar4 << 3;
        do {
          ppVar2 = (this->Gedge).
                   super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
                    ((HighsHashTable<std::tuple<int,int,unsigned_int>,void> *)__return_storage_ptr__
                     ,(int *)((long)&ppVar2->first + lVar6),(int *)((long)&uStack_38 + 4),
                     (uint *)((long)&ppVar2->second + lVar6));
          piVar3 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 8;
          iVar4 = iVar4 + 1;
        } while (iVar4 != piVar3[lVar5]);
      }
      lVar6 = lVar5;
    } while (lVar5 < this->numCol);
  }
  return __return_storage_ptr__;
}

Assistant:

HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>>
HighsSymmetryDetection::dumpCurrentGraph() {
  HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>> graphTriplets;

  for (HighsInt i = 0; i < numCol; ++i) {
    HighsInt colCell = vertexToCell[i];
    for (HighsInt j = Gstart[i]; j != Gend[i]; ++j)
      graphTriplets.insert(vertexToCell[Gedge[j].first], colCell,
                           Gedge[j].second);
    for (HighsInt j = Gend[i]; j != Gstart[i + 1]; ++j)
      graphTriplets.insert(Gedge[j].first, colCell, Gedge[j].second);
  }

  return graphTriplets;
}